

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

Vec_Ptr_t *
Llb_CoreConstructAll(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  int nCap;
  uint uVar1;
  void **__s;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vLower;
  DdManager *pDVar2;
  int i;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *vUpper;
  
  nCap = vResult->nSize;
  p_00 = Vec_PtrAlloc(nCap);
  p_00->nSize = nCap;
  __s = p_00->pArray;
  memset(__s,0,(long)nCap << 3);
  uVar1 = vResult->nSize;
  vUpper = (Vec_Ptr_t *)0x0;
  uVar3 = uVar1;
  while( true ) {
    if ((int)uVar3 < 1) {
      return p_00;
    }
    vLower = (Vec_Ptr_t *)Vec_PtrEntry(vResult,uVar3 - 1);
    if ((int)uVar3 < vResult->nSize) {
      pDVar2 = Llb_ImgPartition(p,vLower,vUpper,TimeTarget);
    }
    else {
      pDVar2 = Llb_DriverLastPartition(p,vVarsNs,TimeTarget);
    }
    if (pDVar2 == (DdManager *)0x0) break;
    if (nCap < (int)uVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    uVar3 = uVar3 - 1;
    __s[uVar3] = pDVar2;
    vUpper = vLower;
  }
  i = 0;
  iVar4 = 0;
  if (0 < nCap) {
    iVar4 = nCap;
  }
  for (; iVar4 != i; i = i + 1) {
    pDVar2 = (DdManager *)Vec_PtrEntry(p_00,i);
    if (pDVar2 != (DdManager *)0x0) {
      if (pDVar2->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(pDVar2,pDVar2->bFunc);
      }
      Extra_StopManager(pDVar2);
    }
  }
  Vec_PtrFree(p_00);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_CoreConstructAll( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
    DdManager * dd;
    Vec_Ptr_t * vDdMans;
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    vDdMans = Vec_PtrStart( Vec_PtrSize(vResult) );
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            dd = Llb_ImgPartition( p, vLower, vUpper, TimeTarget );
        else
            dd = Llb_DriverLastPartition( p, vVarsNs, TimeTarget );
        if ( dd == NULL )
        {
            Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
            {
                if ( dd == NULL )
                    continue;
                if ( dd->bFunc )
                    Cudd_RecursiveDeref( dd, dd->bFunc );
                Extra_StopManager( dd );
            }
            Vec_PtrFree( vDdMans );
            return NULL;
        }
        Vec_PtrWriteEntry( vDdMans, i, dd );
        vUpper = vLower;
    }
    return vDdMans;
}